

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall wallet::CWallet::UpgradeKeyMetadata(CWallet *this)

{
  long lVar1;
  bool bVar2;
  LegacyScriptPubKeyMan *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsLocked(this);
  if ((!bVar2) && (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 2) == 0)) {
    this_00 = GetLegacyScriptPubKeyMan(this);
    if (this_00 != (LegacyScriptPubKeyMan *)0x0) {
      LegacyScriptPubKeyMan::UpgradeKeyMetadata(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        SetWalletFlag(this,2);
        return;
      }
      goto LAB_00c0cee5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00c0cee5:
  __stack_chk_fail();
}

Assistant:

void CWallet::UpgradeKeyMetadata()
{
    if (IsLocked() || IsWalletFlagSet(WALLET_FLAG_KEY_ORIGIN_METADATA)) {
        return;
    }

    auto spk_man = GetLegacyScriptPubKeyMan();
    if (!spk_man) {
        return;
    }

    spk_man->UpgradeKeyMetadata();
    SetWalletFlag(WALLET_FLAG_KEY_ORIGIN_METADATA);
}